

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ml_sse3.c
# Opt level: O0

__m128 reduce_max(__m128 reg)

{
  undefined1 auVar1 [16];
  float fVar2;
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  __m128 afVar6;
  __m128 tmp_reg;
  __m128 reg_local;
  
  auVar1._8_8_ = reg._0_8_;
  auVar1._0_8_ = reg._0_8_;
  auVar4._8_8_ = reg._0_8_;
  auVar4._0_8_ = reg._0_8_;
  auVar4 = maxps(auVar1,auVar4);
  reg_local[0] = auVar4._0_4_;
  fVar2 = reg_local[0];
  reg_local[1] = auVar4._4_4_;
  fVar3 = reg_local[1];
  reg_local[2] = auVar4._8_4_;
  reg_local[3] = auVar4._12_4_;
  auVar5._8_4_ = reg_local[3];
  auVar5._12_4_ = reg_local[2];
  auVar5._0_4_ = reg_local[1];
  auVar5._4_4_ = reg_local[0];
  auVar5 = maxps(auVar4,auVar5);
  reg_local._0_8_ = auVar5._0_8_;
  afVar6[2] = fVar3;
  afVar6[3] = fVar2;
  afVar6[0] = reg_local[0];
  afVar6[1] = reg_local[1];
  return afVar6;
}

Assistant:

static inline __m128 reduce_max(__m128 reg) {
  __m128 tmp_reg;

  tmp_reg = _mm_shuffle_ps(reg, reg, 0x4e);  // 01 00 11 10
  reg = _mm_max_ps(reg, tmp_reg);

  tmp_reg = _mm_shuffle_ps(reg, reg, 0xb1);  // 10 11 00 01
  reg = _mm_max_ps(reg, tmp_reg);

  return reg;
}